

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O0

void __thiscall MetricsDiscovery::MDHelper::PrintMetricNames(MDHelper *this,ostream *os)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  long *plVar4;
  ostream *poVar5;
  ostream *in_RSI;
  long in_RDI;
  uint32_t i_2;
  uint32_t ioInfoCount;
  uint32_t i_1;
  uint32_t i;
  uint local_20;
  uint local_18;
  uint local_14;
  
  if (((((*(byte *)(in_RDI + 0x20) & 1) != 0) && (*(long *)(in_RDI + 0x48) != 0)) &&
      (*(long *)(in_RDI + 0x50) != 0)) && (uVar2 = std::ios::good(), (uVar2 & 1) != 0)) {
    std::operator<<(in_RSI,"kernel,");
    for (local_14 = 0; lVar3 = (**(code **)(**(long **)(in_RDI + 0x50) + 0x10))(),
        local_14 < *(uint *)(lVar3 + 0x20); local_14 = local_14 + 1) {
      plVar4 = (long *)(**(code **)(**(long **)(in_RDI + 0x50) + 0x18))
                                 (*(long **)(in_RDI + 0x50),local_14);
      lVar3 = (**(code **)(*plVar4 + 0x10))();
      poVar5 = std::operator<<(in_RSI,*(char **)(lVar3 + 8));
      std::operator<<(poVar5,",");
      if ((*(byte *)(in_RDI + 0x22) & 1) != 0) {
        poVar5 = std::operator<<(in_RSI,"max_");
        plVar4 = (long *)(**(code **)(**(long **)(in_RDI + 0x50) + 0x18))
                                   (*(long **)(in_RDI + 0x50),local_14);
        lVar3 = (**(code **)(*plVar4 + 0x10))();
        poVar5 = std::operator<<(poVar5,*(char **)(lVar3 + 8));
        std::operator<<(poVar5,",");
      }
    }
    std::operator<<(in_RSI,",");
    for (local_18 = 0; lVar3 = (**(code **)(**(long **)(in_RDI + 0x50) + 0x10))(),
        local_18 < *(uint *)(lVar3 + 0x24); local_18 = local_18 + 1) {
      plVar4 = (long *)(**(code **)(**(long **)(in_RDI + 0x50) + 0x20))
                                 (*(long **)(in_RDI + 0x50),local_18);
      lVar3 = (**(code **)(*plVar4 + 0x10))();
      poVar5 = std::operator<<(in_RSI,*(char **)(lVar3 + 8));
      std::operator<<(poVar5,",");
    }
    if ((*(uint *)(in_RDI + 0x24) & 1) != 0) {
      std::operator<<(in_RSI,",");
      lVar3 = (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))();
      uVar1 = *(uint *)(lVar3 + 0x18);
      for (local_20 = 0; local_20 < uVar1; local_20 = local_20 + 1) {
        plVar4 = (long *)(**(code **)(**(long **)(in_RDI + 0x48) + 0x40))
                                   (*(long **)(in_RDI + 0x48),local_20);
        lVar3 = (**(code **)(*plVar4 + 0x10))();
        poVar5 = std::operator<<(in_RSI,*(char **)(lVar3 + 8));
        std::operator<<(poVar5,",");
      }
    }
    std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void MDHelper::PrintMetricNames( std::ostream& os )
{
    if( !m_Initialized || !m_ConcurrentGroup || !m_MetricSet || !os.good() )
    {
        DebugPrint("Can't PrintMetricNames!\n");
        return;
    }

    os << "kernel,";

    for( uint32_t i = 0; i < m_MetricSet->GetParams()->MetricsCount; i++ )
    {
        os << m_MetricSet->GetMetric( i )->GetParams()->SymbolName << ",";
        if( m_IncludeMaxValues )
        {
            os << "max_" << m_MetricSet->GetMetric( i )->GetParams()->SymbolName << ",";
        }
    }

    os << ",";

    for(uint32_t i = 0; i < m_MetricSet->GetParams()->InformationCount; i++)
    {
        os << m_MetricSet->GetInformation( i )->GetParams()->SymbolName << ",";
    }

    if( m_APIMask & API_TYPE_IOSTREAM )
    {
        os << ",";

        const uint32_t ioInfoCount =
            m_ConcurrentGroup->GetParams()->IoMeasurementInformationCount;
        for( uint32_t i = 0; i < ioInfoCount; i++ )
        {
            os << m_ConcurrentGroup->GetIoMeasurementInformation( i )->GetParams()->SymbolName << ",";
        }
    }

    os << std::endl;
}